

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.hpp
# Opt level: O3

int njoy::ENDFtk::section::Type<1,_458>::PolynomialComponents::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int args_1;
  undefined8 *puVar1;
  
  args_1 = (int)sig * 0x12 + 0x12;
  if (args_1 == (int)ctx) {
    return (int)sig * 9;
  }
  tools::Log::error<char_const*>("Encountered illegal NPL value");
  tools::Log::info<char_const*,int>("NPL must be equal to {}",args_1);
  tools::Log::info<char_const*,int>("NPL value: {}",(int)ctx);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void verify( int NPL, int NPLY ) {

  if ( NPL != ( NPLY + 1 ) * 18 ) {

    Log::error( "Encountered illegal NPL value" );
    Log::info( "NPL must be equal to {}", ( NPLY + 1 ) * 18 );
    Log::info( "NPL value: {}", NPL );
    throw std::exception();
  }

}